

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

int __thiscall fmcalc::init(fmcalc *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  init_programme(this,(int)ctx);
  if (this->stepped_ == true) {
    init_profile_step(this);
  }
  else {
    init_profile(this);
  }
  init_policytc(this,(int)ctx);
  init_fmxref(this);
  return extraout_EAX;
}

Assistant:

void fmcalc::init(int MaxRunLevel)
{
	init_programme(MaxRunLevel);
	if (stepped_ == true) {
		init_profile_step();
	}
	else {
		init_profile();
	}
	init_policytc(MaxRunLevel);
	init_fmxref();	
	
}